

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O1

bool __thiscall ON_OutlineFigure::NegateY(ON_OutlineFigure *this)

{
  float fVar1;
  double dVar2;
  ON_OutlineFigurePoint *pOVar3;
  Orientation OVar4;
  bool bVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  
  uVar6 = (ulong)(uint)(this->m_points).m_count;
  if (uVar6 == 0) {
    bVar8 = false;
  }
  else {
    pOVar3 = (this->m_points).m_a;
    lVar7 = 0;
    bVar8 = false;
    do {
      fVar1 = *(float *)((long)&(pOVar3->m_point).y + lVar7);
      if ((fVar1 < 1.234321e+38) && (((fVar1 != 0.0 || (NAN(fVar1))) && (-1.234321e+38 < fVar1)))) {
        *(float *)((long)&(pOVar3->m_point).y + lVar7) = -fVar1;
        bVar8 = true;
      }
      lVar7 = lVar7 + 0xc;
    } while (uVar6 * 0xc != lVar7);
  }
  if (!bVar8) {
    return bVar8;
  }
  if (this->m_orientation == Clockwise) {
    OVar4 = CounterClockwise;
  }
  else {
    if (this->m_orientation != CounterClockwise) goto LAB_00494f36;
    OVar4 = Clockwise;
  }
  this->m_orientation = OVar4;
LAB_00494f36:
  bVar5 = ON_IsValid(this->m_area_estimate);
  if (bVar5) {
    dVar2 = this->m_area_estimate;
    if ((dVar2 != 0.0) || (NAN(dVar2))) {
      this->m_area_estimate = -dVar2;
    }
  }
  return bVar8;
}

Assistant:

bool ON_OutlineFigure::NegateY()
{
  bool rc = false;
  const ON__UINT32 count = m_points.UnsignedCount();
  ON_OutlineFigurePoint* a = m_points.Array();
  for (ON__UINT32 i = 0; i < count; i++)
  {
    if ( ON_OutlineFigure::Internal_NegateY(a[i].m_point) )
      rc = true;
  }

  if (rc)
  {
    if (ON_OutlineFigure::Orientation::Clockwise == m_orientation)
      m_orientation = ON_OutlineFigure::Orientation::CounterClockwise;
    else if (ON_OutlineFigure::Orientation::CounterClockwise == m_orientation)
      m_orientation = ON_OutlineFigure::Orientation::Clockwise;

    if (ON_IsValid(m_area_estimate) && 0.0 != m_area_estimate)
      m_area_estimate = -m_area_estimate;
  }

  return rc;
}